

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

int __thiscall
FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>
::size(FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>
       *this)

{
  int *piVar1;
  int rsz;
  int lsz;
  int local_10;
  int local_c [3];
  
  local_c[0] = FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>_>_>
               ::size((FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>_>_>
                       *)0x1ef685a);
  local_10 = FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
             ::size((FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                     *)0x1ef686d);
  piVar1 = std::max<int>(local_c,&local_10);
  return *piVar1;
}

Assistant:

int size() const {
    int lsz = left_.size(), rsz = right_.size();
    return std::max(lsz, rsz);
  }